

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastSR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  unsigned_long v1;
  byte bVar1;
  ushort uVar2;
  SerialArena *this;
  __int_type_conflict3 _Var3;
  __pointer_type pSVar4;
  int iVar5;
  uint uVar6;
  Rep *pRVar7;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar8;
  Nonnull<const_char_*> failure_msg;
  string *s;
  ulong uVar9;
  char *pcVar10;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar11;
  long extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  long extraout_RDX_01;
  long lVar12;
  long extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  TcParseTableBase *pTVar13;
  unsigned_long v2;
  TcParseTableBase *ptr_00;
  uint *puVar14;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 unaff_R13;
  long in_FS_OFFSET;
  pair<const_char_*,_int> pVar15;
  LogMessageFatal local_40;
  
  if (data.field_0._0_2_ != 0) {
    pcVar10 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar10;
  }
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
            ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this_00 & 7) != 0) {
    AlignFail(this_00);
  }
  uVar2 = *(ushort *)ptr;
  if ((long *)this_00[2].data == (long *)0x0) {
LAB_0044c46a:
    do {
      ptr_00 = (TcParseTableBase *)((long)ptr + 2);
      s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
      ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
      ctx_00 = extraout_RDX_03;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_0044c56c;
      pVVar8 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
      iVar5 = utf8_range_IsValid((pVVar8->_M_dataplus)._M_p,pVVar8->_M_string_length);
      if (iVar5 == 0) {
        ReportFastUtf8Error((int)(char)uVar2 + (uint)uVar2 >> 1,table);
      }
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_0044c558;
    } while (*(ushort *)ptr == uVar2);
  }
  else {
    data.field_0.data = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0xffffffffffffff80;
    lVar12 = *(long *)(in_FS_OFFSET + -0x78);
    if (lVar12 != *(long *)this_00[2].data) goto LAB_0044c46a;
    this = *(SerialArena **)(in_FS_OFFSET + -0x70);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
    pTVar13 = (TcParseTableBase *)ptr;
    if (((ulong)data.field_0 & 1) == 0) {
      uVar6 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
    }
    else {
      pRVar7 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
      uVar6 = pRVar7->allocated_size;
      lVar12 = extraout_RDX;
    }
    if (uVar6 != *(uint *)(this_00 + 1)) goto LAB_0044c46a;
    aVar11._0_4_ = (int)(char)uVar2 + (uint)uVar2 >> 1;
    aVar11.data._4_4_ = 0;
    data.field_0 = aVar11;
    do {
      bVar1 = (byte)*(ushort *)((long)ptr + 2);
      ptr_00 = (TcParseTableBase *)(ulong)bVar1;
      uVar6 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar15 = ReadSizeFallback((char *)((long)ptr + 2),(uint)bVar1);
        uVar6 = pVar15.second;
      }
      else {
        pVar15._8_8_ = lVar12;
        pVar15.first = (char *)((long)ptr + 3);
        ptr_00 = pTVar13;
      }
      ctx_00 = pVar15._8_8_;
      pTVar13 = (TcParseTableBase *)pVar15.first;
      if (pTVar13 == (TcParseTableBase *)0x0) {
        ptr = (char *)0x0;
      }
      else {
        _Var3 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
        if (_Var3 != 0) {
          v1 = _Var3 - 0x20;
          (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = v1;
          pSVar4 = (this->string_block_)._M_b._M_p;
          v2 = (ulong)pSVar4->allocated_size_ - 0x10;
          if (v2 < v1) {
            failure_msg = absl::lts_20250127::log_internal::
                          MakeCheckOpString<unsigned_long,unsigned_long>
                                    (v1,v2,"offset <= effective_size()");
          }
          else {
            failure_msg = (Nonnull<const_char_*>)0x0;
          }
          if (failure_msg != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/string_block.h"
                       ,0xa2,failure_msg);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
          }
          unaff_R13.data = (long)&pSVar4[-1].next_ + _Var3;
        }
        data.field_0 = unaff_R13;
        if (_Var3 == 0) {
          data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                         SerialArena::AllocateFromStringBlockFallback(this);
        }
        *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
        *(undefined8 *)((long)data.field_0 + 8) = 0;
        *(undefined1 *)((long)data.field_0 + 0x10) = 0;
        RepeatedPtrFieldBase::AddAllocatedForParse
                  ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
        ptr = EpsCopyInputStream::ReadString
                        (&ctx->super_EpsCopyInputStream,(char *)pTVar13,uVar6,(string *)data.field_0
                        );
        ctx_00 = extraout_RDX_00;
        ptr_00 = pTVar13;
      }
      if ((ushort *)ptr == (ushort *)0x0) {
LAB_0044c56c:
        pcVar10 = Error(msg,(char *)ptr_00,ctx_00,data,table,hasbits);
        return pcVar10;
      }
      pVVar8 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
      pTVar13 = (TcParseTableBase *)pVVar8->_M_string_length;
      iVar5 = utf8_range_IsValid((pVVar8->_M_dataplus)._M_p,(size_t)pTVar13);
      lVar12 = extraout_RDX_01;
      if (iVar5 == 0) {
        pTVar13 = table;
        ReportFastUtf8Error(aVar11._0_4_,table);
        lVar12 = extraout_RDX_02;
      }
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_0044c558;
    } while (*(ushort *)ptr == uVar2);
  }
  if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar6 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar6 & 7) == 0) {
      uVar9 = (ulong)(uVar6 & 0xfffffff8);
      pcVar10 = (char *)(**(code **)(&table[1].has_bits_offset + uVar9))
                                  (msg,ptr,ctx,
                                   (ulong)*(ushort *)ptr ^
                                   *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2),table,hasbits);
      return pcVar10;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar2 = table->has_bits_offset;
joined_r0x0044c568:
  if ((ulong)uVar2 != 0) {
    puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)uVar2);
    if (((ulong)puVar14 & 3) != 0) {
      AlignFail();
    }
    *puVar14 = *puVar14 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
LAB_0044c558:
  uVar2 = table->has_bits_offset;
  goto joined_r0x0044c568;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastSR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<
      uint16_t, RepeatedPtrField<std::string>, kUtf8ValidateOnly>(
      PROTOBUF_TC_PARAM_PASS);
}